

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# up_xtreme.c
# Opt level: O0

mraa_result_t mraa_upxtreme_get_pin_index(mraa_board_t *board,char *name,int *pin_index)

{
  int iVar1;
  int local_2c;
  int i;
  int *pin_index_local;
  char *name_local;
  mraa_board_t *board_local;
  
  local_2c = 0;
  while( true ) {
    if (board->phy_pin_count <= local_2c) {
      syslog(2,"UP Xtreme: Failed to find pin name %s",name);
      return MRAA_ERROR_INVALID_RESOURCE;
    }
    iVar1 = strncmp(name,board->pins[local_2c].name,0xc);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  *pin_index = local_2c;
  return MRAA_SUCCESS;
}

Assistant:

static mraa_result_t
mraa_upxtreme_get_pin_index(mraa_board_t* board, char* name, int* pin_index)
{
    int i;
    for (i = 0; i < board->phy_pin_count; ++i) {
        if (strncmp(name, board->pins[i].name, MRAA_PIN_NAME_SIZE) == 0) {
            *pin_index = i;
            return MRAA_SUCCESS;
        }
    }

    syslog(LOG_CRIT, "UP Xtreme: Failed to find pin name %s", name);

    return MRAA_ERROR_INVALID_RESOURCE;
}